

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-passwd.c
# Opt level: O3

int run_test_get_group(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  long extraout_RDX;
  addrinfo *ai;
  uv_loop_t *unaff_RBX;
  int iVar3;
  uv_getaddrinfo_t *__ptr;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_group_t grp;
  uv_passwd_t pwd;
  undefined1 auStack_200 [24];
  void *pvStack_1e8;
  uv_getaddrinfo_t uStack_1e0;
  uv_loop_t *puStack_140;
  undefined8 uStack_130;
  code *pcStack_128;
  long lStack_120;
  long lStack_118;
  uv_getaddrinfo_t uStack_110;
  uv_loop_t *puStack_70;
  size_t local_60;
  size_t local_58;
  uv_group_t local_50;
  uv_uid_t local_28;
  undefined4 uStack_24;
  
  puStack_70 = (uv_loop_t *)0x1993a1;
  iVar1 = uv_os_get_passwd((uv_passwd_t *)&stack0xffffffffffffffc8);
  local_50.groupname = (char *)(long)iVar1;
  local_60 = 0;
  if (local_50.groupname == (char *)0x0) {
    puStack_70 = (uv_loop_t *)0x1993cf;
    iVar1 = uv_os_get_group(&local_50,local_28);
    local_60 = (size_t)iVar1;
    local_58 = 0;
    if (local_60 != 0) goto LAB_0019948b;
    local_60 = CONCAT44(uStack_24,local_28);
    local_58 = local_50.gid;
    if (local_60 != local_50.gid) goto LAB_0019949a;
    puStack_70 = (uv_loop_t *)0x19941d;
    local_60 = strlen(local_50.groupname);
    local_58 = 0;
    if ((long)local_60 < 1) goto LAB_001994a9;
    puStack_70 = (uv_loop_t *)0x199441;
    uv_os_free_group(&local_50);
    unaff_RBX = (uv_loop_t *)&stack0xffffffffffffffc8;
    puStack_70 = (uv_loop_t *)0x19944e;
    uv_os_free_passwd((uv_passwd_t *)unaff_RBX);
    puStack_70 = (uv_loop_t *)0x199458;
    iVar1 = uv_os_get_group((uv_group_t *)0x0,local_28);
    local_60 = (size_t)iVar1;
    local_58 = 0xffffffffffffffea;
    if (local_60 == 0xffffffffffffffea) {
      return 0;
    }
  }
  else {
    puStack_70 = (uv_loop_t *)0x19948b;
    run_test_get_group_cold_1();
LAB_0019948b:
    puStack_70 = (uv_loop_t *)0x19949a;
    run_test_get_group_cold_2();
LAB_0019949a:
    puStack_70 = (uv_loop_t *)0x1994a9;
    run_test_get_group_cold_3();
LAB_001994a9:
    puStack_70 = (uv_loop_t *)0x1994b8;
    run_test_get_group_cold_4();
  }
  puStack_70 = (uv_loop_t *)0x1994c7;
  run_test_get_group_cold_5();
  iVar3 = (int)&lStack_120;
  lStack_118 = -0x16;
  pcStack_128 = (code *)0x1994de;
  puStack_70 = unaff_RBX;
  puVar2 = uv_default_loop();
  pcStack_128 = (code *)0x1994fa;
  iVar1 = uv_getaddrinfo(puVar2,&uStack_110,abort,(char *)0x0,(char *)0x0,(addrinfo *)0x0);
  lStack_120 = (long)iVar1;
  if (lStack_118 == lStack_120) {
    pcStack_128 = (code *)0x199514;
    puVar2 = uv_default_loop();
    pcStack_128 = (code *)0x199535;
    iVar1 = uv_getaddrinfo(puVar2,&uStack_110,getaddrinfo_fail_cb,"example.invalid.",(char *)0x0,
                           (addrinfo *)0x0);
    lStack_118 = (long)iVar1;
    lStack_120 = 0;
    if (lStack_118 != 0) goto LAB_0019960a;
    pcStack_128 = (code *)0x199558;
    puVar2 = uv_default_loop();
    pcStack_128 = (code *)0x199562;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_118 = (long)iVar1;
    lStack_120 = 0;
    if (lStack_118 != 0) goto LAB_00199617;
    lStack_118 = 1;
    lStack_120 = (long)fail_cb_called;
    if (lStack_120 != 1) goto LAB_00199624;
    pcStack_128 = (code *)0x1995a8;
    unaff_RBX = uv_default_loop();
    pcStack_128 = (code *)0x1995bc;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_128 = (code *)0x1995c6;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_118 = 0;
    pcStack_128 = (code *)0x1995d4;
    puVar2 = uv_default_loop();
    pcStack_128 = (code *)0x1995dc;
    iVar1 = uv_loop_close(puVar2);
    lStack_120 = (long)iVar1;
    if (lStack_118 == lStack_120) {
      pcStack_128 = (code *)0x1995f2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_128 = (code *)0x19960a;
    run_test_getaddrinfo_fail_cold_1();
LAB_0019960a:
    pcStack_128 = (code *)0x199617;
    run_test_getaddrinfo_fail_cold_2();
LAB_00199617:
    pcStack_128 = (code *)0x199624;
    run_test_getaddrinfo_fail_cold_3();
LAB_00199624:
    pcStack_128 = (code *)0x199631;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_128 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  pcStack_128 = (code *)(long)fail_cb_called;
  uStack_130 = 0;
  if (pcStack_128 == (code *)0x0) {
    pcStack_128 = (code *)(long)iVar3;
    uStack_130 = 0;
    if (-1 < (long)pcStack_128) goto LAB_001996a6;
    if (extraout_RDX == 0) {
      puStack_140 = (uv_loop_t *)0x19968c;
      uv_freeaddrinfo((addrinfo *)0x0);
      fail_cb_called = fail_cb_called + 1;
      return extraout_EAX;
    }
  }
  else {
    puStack_140 = (uv_loop_t *)0x1996a6;
    getaddrinfo_fail_cb_cold_1();
LAB_001996a6:
    puStack_140 = (uv_loop_t *)0x1996b5;
    getaddrinfo_fail_cb_cold_2();
  }
  puStack_140 = (uv_loop_t *)run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  pvStack_1e8 = (void *)0x0;
  auStack_200._8_8_ = (uv_loop_t *)0x1996d3;
  puStack_140 = unaff_RBX;
  puVar2 = uv_default_loop();
  auStack_200._8_8_ = (uv_loop_t *)0x1996ef;
  iVar1 = uv_getaddrinfo(puVar2,&uStack_1e0,(uv_getaddrinfo_cb)0x0,"example.invalid.",(char *)0x0,
                         (addrinfo *)0x0);
  auStack_200._16_8_ = SEXT48(iVar1);
  if ((long)auStack_200._16_8_ < (long)pvStack_1e8) {
    auStack_200._8_8_ = (uv_loop_t *)0x19970d;
    uv_freeaddrinfo(uStack_1e0.addrinfo);
    auStack_200._8_8_ = (uv_loop_t *)0x199712;
    unaff_RBX = uv_default_loop();
    auStack_200._8_8_ = (uv_loop_t *)0x199726;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    auStack_200._8_8_ = (uv_loop_t *)0x199730;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pvStack_1e8 = (void *)0x0;
    auStack_200._8_8_ = (uv_loop_t *)0x19973e;
    puVar2 = uv_default_loop();
    auStack_200._8_8_ = (uv_loop_t *)0x199746;
    iVar1 = uv_loop_close(puVar2);
    auStack_200._16_8_ = SEXT48(iVar1);
    if (pvStack_1e8 == (void *)auStack_200._16_8_) {
      auStack_200._8_8_ = (uv_loop_t *)0x19975c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_200._8_8_ = (uv_loop_t *)0x199774;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  auStack_200._8_8_ = run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  auStack_200._8_8_ = unaff_RBX;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  puVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(puVar2,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  auStack_200._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_200._0_8_ == (void *)0x0) {
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_200._0_8_ = (void *)0x1;
    if (getaddrinfo_cbs == 1) {
      unaff_RBX = uv_default_loop();
      uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
      uv_run(unaff_RBX,UV_RUN_DEFAULT);
      auStack_200._0_8_ = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if ((void *)auStack_200._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0019987c;
    }
  }
  else {
    run_test_getaddrinfo_basic_cold_1();
  }
  run_test_getaddrinfo_basic_cold_2();
LAB_0019987c:
  __ptr = (uv_getaddrinfo_t *)auStack_200;
  run_test_getaddrinfo_basic_cold_3();
  if (getaddrinfo_handle == __ptr) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    free(__ptr);
    uv_freeaddrinfo(ai);
    return extraout_EAX_00;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getaddrinfo.c"
          ,0x36,"handle","==","getaddrinfo_handle",__ptr,"==",getaddrinfo_handle,unaff_RBX);
  abort();
}

Assistant:

TEST_IMPL(get_group) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  uv_passwd_t pwd;
  uv_group_t grp;
  size_t len;
  int r;

  r = uv_os_get_passwd(&pwd);
  ASSERT_OK(r);

  r = uv_os_get_group(&grp, pwd.gid);

#ifdef _WIN32
  ASSERT_EQ(r, UV_ENOTSUP);
  (void) &len;

#else
  ASSERT_OK(r);
  ASSERT_EQ(pwd.gid, grp.gid);

  len = strlen(grp.groupname);
  ASSERT_GT(len, 0);

  uv_os_free_group(&grp);
#endif

  uv_os_free_passwd(&pwd);

  /* Test invalid input */
  r = uv_os_get_group(NULL, pwd.gid);
#ifdef _WIN32
  ASSERT_EQ(r, UV_ENOTSUP);
#else
  ASSERT_EQ(r, UV_EINVAL);
#endif

  return 0;
}